

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O0

void __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription::setHessianBlock
          (MultipleShootingTranscription *this,MatrixDynSize *hessian,MatrixDynSize *block,
          size_t startRow,size_t startCol)

{
  bool *pbVar1;
  MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>_>
  *this_00;
  unsigned_long blockCols;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_RCX;
  unsigned_long in_RDI;
  ulong in_R8;
  DenseBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffe78;
  MatrixDynSize *in_stack_fffffffffffffea8;
  Index in_stack_fffffffffffffeb8;
  Index in_stack_fffffffffffffec0;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffec8;
  size_t in_stack_fffffffffffffee0;
  size_t in_stack_fffffffffffffee8;
  HessianBlocksMap *in_stack_fffffffffffffef0;
  
  pbVar1 = HessianBlocksMap::operator()
                     (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0)
  ;
  if ((*pbVar1 & 1U) == 0) {
    toEigen(in_stack_fffffffffffffea8);
    toEigen(in_stack_fffffffffffffea8);
    iDynTree::MatrixDynSize::rows();
    iDynTree::MatrixDynSize::cols();
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::
    block<unsigned_long,unsigned_long>
              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_RDI,
               (unsigned_long)in_stack_fffffffffffffea8);
    Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>,-1,-1,false>::
    operator=((Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>
               *)in_RCX,in_stack_fffffffffffffe78);
    pbVar1 = HessianBlocksMap::operator()
                       (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                        in_stack_fffffffffffffee0);
    *pbVar1 = true;
  }
  else {
    toEigen(in_stack_fffffffffffffea8);
    toEigen(in_stack_fffffffffffffea8);
    this_00 = (MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>_>
               *)(in_R8 & 0xffffffff);
    blockCols = iDynTree::MatrixDynSize::rows();
    iDynTree::MatrixDynSize::cols();
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::
    block<unsigned_long,unsigned_long>
              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_RDI,
               blockCols);
    Eigen::
    MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>,-1,-1,false>>
    ::operator+=(this_00,in_RCX);
  }
  return;
}

Assistant:

void setHessianBlock(MatrixDynSize& hessian, const MatrixDynSize& block, size_t startRow, size_t startCol) {
                if (m_hessianBlocks(startRow, startCol)) {
                    toEigen(hessian).block(static_cast<Eigen::Index>(startRow), static_cast<unsigned int>(startCol), block.rows(), block.cols()) += toEigen(block);
                } else {
                    toEigen(hessian).block(static_cast<Eigen::Index>(startRow), static_cast<unsigned int>(startCol), block.rows(), block.cols()) = toEigen(block);
                    m_hessianBlocks(startRow, startCol) = true;
                }
            }